

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_string *
pugi::impl::anon_unknown_0::xpath_string::from_heap
          (xpath_string *__return_storage_ptr__,char_t *begin,char_t *end,xpath_allocator *alloc)

{
  char *__dest;
  void *pvVar1;
  xpath_string *pxVar2;
  char *pcVar3;
  size_t __n;
  
  if (end < begin) {
    __assert_fail("begin <= end",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                  ,0x1e8f,
                  "static xpath_string pugi::impl::(anonymous namespace)::xpath_string::from_heap(const char_t *, const char_t *, xpath_allocator *)"
                 );
  }
  pcVar3 = "";
  if (begin != end) {
    __n = (long)end - (long)begin;
    __dest = (char *)xpath_allocator::allocate(alloc,__n + 1);
    if (__dest != (char *)0x0) {
      pvVar1 = memcpy(__dest,begin,__n);
      __dest[__n] = '\0';
      pxVar2 = (xpath_string *)CONCAT71((int7)((ulong)pvVar1 >> 8),1);
      pcVar3 = __dest;
      goto LAB_00190ac2;
    }
  }
  pxVar2 = (xpath_string *)0x0;
  __n = 0;
LAB_00190ac2:
  __return_storage_ptr__->_buffer = pcVar3;
  __return_storage_ptr__->_uses_heap = SUB81(pxVar2,0);
  __return_storage_ptr__->_length_heap = __n;
  return pxVar2;
}

Assistant:

static xpath_string from_heap(const char_t* begin, const char_t* end, xpath_allocator* alloc)
		{
			assert(begin <= end);

			if (begin == end)
				return xpath_string();

			size_t length = static_cast<size_t>(end - begin);
			const char_t* data = duplicate_string(begin, length, alloc);

			return data ? xpath_string(data, true, length) : xpath_string();
		}